

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::ExtensionGenerator::DetermineNeededFiles
          (ExtensionGenerator *this,
          flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *deps)

{
  FileDescriptor *pFVar1;
  ObjectiveCType OVar2;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  FieldDescriptor *pFVar5;
  FileDescriptor *local_30;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>::iterator,_bool>
  local_28;
  
  pFVar5 = this->descriptor_;
  pFVar1 = pFVar5->containing_type_->file_;
  if (pFVar5->file_ != pFVar1) {
    local_30 = pFVar1;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::emplace<const_google::protobuf::FileDescriptor_*,_0>
              (&local_28,
               &deps->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ,&local_30);
    pFVar5 = this->descriptor_;
  }
  OVar2 = GetObjectiveCType(pFVar5);
  if (OVar2 == OBJECTIVECTYPE_ENUM) {
    pEVar4 = FieldDescriptor::enum_type(this->descriptor_);
    pFVar5 = this->descriptor_;
    local_30 = pEVar4->file_;
  }
  else {
    if (OVar2 != OBJECTIVECTYPE_MESSAGE) {
      return;
    }
    pDVar3 = FieldDescriptor::message_type(this->descriptor_);
    pFVar5 = this->descriptor_;
    local_30 = pDVar3->file_;
  }
  if (pFVar5->file_ != local_30) {
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::emplace<const_google::protobuf::FileDescriptor_*,_0>
              (&local_28,
               &deps->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ,&local_30);
  }
  return;
}

Assistant:

void ExtensionGenerator::DetermineNeededFiles(
    absl::flat_hash_set<const FileDescriptor*>* deps) const {
  const Descriptor* extended_type = descriptor_->containing_type();
  if (descriptor_->file() != extended_type->file()) {
    deps->insert(extended_type->file());
  }

  const ObjectiveCType objc_type = GetObjectiveCType(descriptor_);
  if (objc_type == OBJECTIVECTYPE_MESSAGE) {
    const Descriptor* value_msg_descriptor = descriptor_->message_type();
    if (descriptor_->file() != value_msg_descriptor->file()) {
      deps->insert(value_msg_descriptor->file());
    }
  } else if (objc_type == OBJECTIVECTYPE_ENUM) {
    const EnumDescriptor* value_enum_descriptor = descriptor_->enum_type();
    if (descriptor_->file() != value_enum_descriptor->file()) {
      deps->insert(value_enum_descriptor->file());
    }
  }
}